

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::detail::binary_assert<0,std::__cxx11::string,char[27]>
               (Enum at,char *file,int line,char *expr,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               char (*rhs) [27])

{
  bool *other;
  code *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  byte extraout_AL;
  ContextOptions *pCVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  String local_1d0;
  String local_1b8;
  undefined1 local_1a0 [8];
  ResultBuilder rb;
  String local_e8;
  undefined1 local_d0 [8];
  ResultBuilder rb_1;
  bool failed;
  char (*rhs_local) [27];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  char *expr_local;
  int line_local;
  char *file_local;
  Enum at_local;
  
  bVar2 = RelationalComparator<0,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[27]>
          ::operator()((RelationalComparator<0,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[27]>
                        *)&rb_1.super_AssertData.m_exception_string.field_0x1e,lhs,rhs);
  rb_1.super_AssertData.m_exception_string._31_1_ = (bVar2 ^ 0xffU) & 1;
  if ((is_running_in_test & 1) == 0) {
    if (rb_1.super_AssertData.m_exception_string._31_1_ != 0) {
      String::String(&local_e8,"");
      ResultBuilder::ResultBuilder((ResultBuilder *)local_d0,at,file,line,expr,"",&local_e8);
      String::~String(&local_e8);
      rb_1.super_AssertData.m_expr._0_1_ = rb_1.super_AssertData.m_exception_string._31_1_ & 1;
      stringifyBinaryExpr<std::__cxx11::string,char[27]>
                ((String *)&rb.super_AssertData.m_exception_string.isContains,(detail *)lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17eaa4,*rhs,
                 (char (*) [27])expr);
      other = &rb.super_AssertData.m_exception_string.isContains;
      String::operator=((String *)((long)&rb_1.super_AssertData.m_exception.field_0 + 0x10),
                        (String *)other);
      String::~String((String *)other);
      failed_out_of_a_testing_context((AssertData *)local_d0);
      bVar2 = isDebuggerActive();
      if ((bVar2) && (pCVar4 = getContextOptions(), (pCVar4->no_breaks & 1U) == 0)) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
      bVar2 = checkIfShouldThrow(at);
      if (bVar2) {
        throwException();
      }
      ResultBuilder::~ResultBuilder((ResultBuilder *)local_d0);
    }
  }
  else {
    String::String(&local_1b8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)local_1a0,at,file,line,expr,"",&local_1b8);
    String::~String(&local_1b8);
    rb.super_AssertData.m_expr._0_1_ = rb_1.super_AssertData.m_exception_string._31_1_ & 1;
    if (((byte)rb.super_AssertData.m_expr != 0) ||
       (pCVar4 = getContextOptions(), __x = extraout_XMM0_Qa, (pCVar4->success & 1U) != 0)) {
      stringifyBinaryExpr<std::__cxx11::string,char[27]>
                (&local_1d0,(detail *)lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17eaa4,*rhs,
                 (char (*) [27])expr);
      String::operator=((String *)((long)&rb.super_AssertData.m_exception.field_0 + 0x10),&local_1d0
                       );
      String::~String(&local_1d0);
      __x = extraout_XMM0_Qa_00;
    }
    ResultBuilder::log((ResultBuilder *)local_1a0,__x);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return (bool)uVar3;
    }
    if ((((byte)rb.super_AssertData.m_expr & 1) != 0) && (bVar2 = checkIfShouldThrow(at), bVar2)) {
      throwException();
    }
    uVar3 = rb_1.super_AssertData.m_exception_string._31_1_;
    ResultBuilder::~ResultBuilder((ResultBuilder *)local_1a0);
    rb_1.super_AssertData.m_exception_string._31_1_ = uVar3;
  }
  return (bool)((rb_1.super_AssertData.m_exception_string._31_1_ ^ 0xff) & 1);
}

Assistant:

DOCTEST_NOINLINE bool binary_assert(assertType::Enum at, const char* file, int line,
                                        const char* expr, const DOCTEST_REF_WRAP(L) lhs,
                                        const DOCTEST_REF_WRAP(R) rhs) {
        bool failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        DOCTEST_ASSERT_IN_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        return !failed;
    }